

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O2

void __thiscall
duckdb::TypeMismatchException::TypeMismatchException
          (TypeMismatchException *this,PhysicalType type_1,PhysicalType type_2,string *msg)

{
  PhysicalType type;
  undefined7 in_register_00000031;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)CONCAT71(in_register_00000031,type_1),type_2);
  ::std::operator+(&local_e0,"Type ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  ::std::operator+(&local_c0,&local_e0," does not match with ");
  TypeIdToString_abi_cxx11_(&local_100,(duckdb *)(ulong)type_2,type);
  ::std::operator+(&local_a0,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
  ::std::operator+(&local_80,&local_a0,". ");
  ::std::operator+(&local_60,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  Exception::Exception(&this->super_Exception,MISMATCH_TYPE,(string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_027accf8;
  return;
}

Assistant:

TypeMismatchException::TypeMismatchException(const PhysicalType type_1, const PhysicalType type_2, const string &msg)
    : Exception(ExceptionType::MISMATCH_TYPE,
                "Type " + TypeIdToString(type_1) + " does not match with " + TypeIdToString(type_2) + ". " + msg) {
}